

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

int mbedtls_blowfish_crypt_cbc
              (mbedtls_blowfish_context *ctx,int mode,size_t length,uchar *iv,uchar *input,
              uchar *output)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = -0x18;
  if ((length & 7) == 0) {
    if (mode == 0) {
      if (length != 0) {
        do {
          uVar1 = *(undefined8 *)input;
          mbedtls_blowfish_crypt_ecb(ctx,0,input,output);
          lVar3 = 0;
          do {
            output[lVar3] = output[lVar3] ^ iv[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
          *(undefined8 *)iv = uVar1;
          input = input + 8;
          output = output + 8;
          length = length - 8;
        } while (length != 0);
      }
    }
    else if (length != 0) {
      do {
        lVar3 = 0;
        do {
          output[lVar3] = iv[lVar3] ^ input[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        mbedtls_blowfish_crypt_ecb(ctx,mode,output,output);
        *(undefined8 *)iv = *(undefined8 *)output;
        input = input + 8;
        output = output + 8;
        length = length - 8;
      } while (length != 0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_blowfish_crypt_cbc( mbedtls_blowfish_context *ctx,
                    int mode,
                    size_t length,
                    unsigned char iv[MBEDTLS_BLOWFISH_BLOCKSIZE],
                    const unsigned char *input,
                    unsigned char *output )
{
    int i;
    unsigned char temp[MBEDTLS_BLOWFISH_BLOCKSIZE];
    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( mode == MBEDTLS_BLOWFISH_ENCRYPT ||
                           mode == MBEDTLS_BLOWFISH_DECRYPT );
    BLOWFISH_VALIDATE_RET( iv != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || input  != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || output != NULL );

    if( length % MBEDTLS_BLOWFISH_BLOCKSIZE )
        return( MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        while( length > 0 )
        {
            memcpy( temp, input, MBEDTLS_BLOWFISH_BLOCKSIZE );
            mbedtls_blowfish_crypt_ecb( ctx, mode, input, output );

            for( i = 0; i < MBEDTLS_BLOWFISH_BLOCKSIZE;i++ )
                output[i] = (unsigned char)( output[i] ^ iv[i] );

            memcpy( iv, temp, MBEDTLS_BLOWFISH_BLOCKSIZE );

            input  += MBEDTLS_BLOWFISH_BLOCKSIZE;
            output += MBEDTLS_BLOWFISH_BLOCKSIZE;
            length -= MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }
    else
    {
        while( length > 0 )
        {
            for( i = 0; i < MBEDTLS_BLOWFISH_BLOCKSIZE; i++ )
                output[i] = (unsigned char)( input[i] ^ iv[i] );

            mbedtls_blowfish_crypt_ecb( ctx, mode, output, output );
            memcpy( iv, output, MBEDTLS_BLOWFISH_BLOCKSIZE );

            input  += MBEDTLS_BLOWFISH_BLOCKSIZE;
            output += MBEDTLS_BLOWFISH_BLOCKSIZE;
            length -= MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }

    return( 0 );
}